

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O3

DdNode * extraBddSpaceFromMatrixNeg(DdManager *dd,DdNode *zA)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *g;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *T;
  uint index;
  
  if (dd->zero == zA) {
    return dd->one;
  }
  if (dd->one == zA) {
    return (DdNode *)((ulong)zA ^ 1);
  }
  pDVar2 = cuddCacheLookup1(dd,extraBddSpaceFromMatrixNeg,zA);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = extraBddSpaceFromMatrixNeg(dd,(zA->type).kids.E);
  if (pDVar2 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  g = extraBddSpaceFromMatrixNeg(dd,(zA->type).kids.T);
  if (g == (DdNode *)0x0) goto LAB_0081e069;
  piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  n = cuddBddAndRecur(dd,pDVar2,g);
  if (n != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar2);
    Cudd_RecursiveDeref(dd,g);
    pDVar3 = extraBddSpaceFromMatrixNeg(dd,(zA->type).kids.E);
    pDVar2 = n;
    if (pDVar3 == (DdNode *)0x0) goto LAB_0081e069;
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar2 = extraBddSpaceFromMatrixPos(dd,(zA->type).kids.T);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
      pDVar2 = pDVar3;
      goto LAB_0081e069;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    g = cuddBddAndRecur(dd,pDVar3,pDVar2);
    if (g == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,pDVar3);
      goto LAB_0081e069;
    }
    T = (DdNode *)((ulong)g & 0xfffffffffffffffe);
    T->ref = T->ref + 1;
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,pDVar2);
    pDVar3 = g;
    if (n == g) {
LAB_0081e0cb:
      piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      T->ref = T->ref - 1;
      cuddCacheInsert1(dd,extraBddSpaceFromMatrixNeg,zA,pDVar3);
      return pDVar3;
    }
    index = zA->index >> 1;
    if (((ulong)g & 1) == 0) {
      pDVar3 = cuddUniqueInter(dd,index,g,n);
      pDVar2 = n;
      if (pDVar3 != (DdNode *)0x0) goto LAB_0081e0cb;
    }
    else {
      pDVar3 = cuddUniqueInter(dd,index,T,(DdNode *)((ulong)n ^ 1));
      pDVar2 = n;
      if (pDVar3 != (DdNode *)0x0) {
        pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
        goto LAB_0081e0cb;
      }
    }
  }
  Cudd_RecursiveDeref(dd,pDVar2);
  pDVar2 = g;
LAB_0081e069:
  Cudd_RecursiveDeref(dd,pDVar2);
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraBddSpaceFromMatrixNeg( DdManager * dd, DdNode * zA )
{
    DdNode * bRes;
    statLine( dd );

    if ( zA == z0 )
        return b1;
    if ( zA == z1 )
        return b0;

    if ( (bRes = cuddCacheLookup1(dd, extraBddSpaceFromMatrixNeg, zA)) )
        return bRes;
    else
    {
        DdNode * bP0, * bP1;
        DdNode * bN0, * bN1;
        DdNode * bRes0, * bRes1; 

        bP0  = extraBddSpaceFromMatrixNeg( dd, cuddE(zA) );
        if ( bP0 == NULL )
            return NULL;
        cuddRef( bP0 );

        bP1  = extraBddSpaceFromMatrixNeg( dd, cuddT(zA) );
        if ( bP1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bP0 );
            return NULL;
        }
        cuddRef( bP1 );

        bRes0  = cuddBddAndRecur( dd, bP0, bP1 );
        if ( bRes0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bP0 );
            Cudd_RecursiveDeref( dd, bP1 );
            return NULL;
        }
        cuddRef( bRes0 );
        Cudd_RecursiveDeref( dd, bP0 );
        Cudd_RecursiveDeref( dd, bP1 );


        bN0  = extraBddSpaceFromMatrixNeg( dd, cuddE(zA) );
        if ( bN0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bN0 );

        bN1  = extraBddSpaceFromMatrixPos( dd, cuddT(zA) );
        if ( bN1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bN0 );
            return NULL;
        }
        cuddRef( bN1 );

        bRes1  = cuddBddAndRecur( dd, bN0, bN1 );
        if ( bRes1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bN0 );
            Cudd_RecursiveDeref( dd, bN1 );
            return NULL;
        }
        cuddRef( bRes1 );
        Cudd_RecursiveDeref( dd, bN0 );
        Cudd_RecursiveDeref( dd, bN1 );


        // consider the case when Res0 and Res1 are the same node 
        if ( bRes0 == bRes1 )
            bRes = bRes1;
        // consider the case when Res1 is complemented 
        else if ( Cudd_IsComplement(bRes1) ) 
        {
            bRes = cuddUniqueInter( dd, zA->index/2, Cudd_Not(bRes1), Cudd_Not(bRes0) );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
            bRes = Cudd_Not(bRes);
        } 
        else 
        {
            bRes = cuddUniqueInter( dd, zA->index/2, bRes1, bRes0 );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
        }
        cuddDeref( bRes0 );
        cuddDeref( bRes1 );

        cuddCacheInsert1( dd, extraBddSpaceFromMatrixNeg, zA, bRes );
        return bRes;
    }
}